

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

void timestamp(void)

{
  tm *__tp;
  ostream *poVar1;
  time_t local_18;
  time_t now;
  
  local_18 = time((time_t *)0x0);
  __tp = localtime(&local_18);
  strftime(timestamp::time_buffer,0x28,"%d %B %Y %I:%M:%S %p",__tp);
  poVar1 = std::operator<<((ostream *)&std::cout,timestamp::time_buffer);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void timestamp ( )

//****************************************************************************80
//
//  Purpose:
//
//    TIMESTAMP prints the current YMDHMS date as a time stamp.
//
//  Example:
//
//    May 31 2001 09:45:54 AM
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    24 September 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    None
//
{
# define TIME_SIZE 40

  static char time_buffer[TIME_SIZE];
  const struct tm *tm;
  time_t now;

  now = time ( NULL );
  tm = localtime ( &now );

  strftime( time_buffer, TIME_SIZE, "%d %B %Y %I:%M:%S %p", tm );

  std::cout << time_buffer << "\n";

  return;
# undef TIME_SIZE
}